

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbaInterfaceExamples.cpp
# Opt level: O0

void readRgba2(char *fileName)

{
  undefined8 in_RDI;
  Array2D<Imf_2_5::Rgba> pixels;
  int width;
  Box2i dw;
  RgbaInputFile file;
  size_t in_stack_00000128;
  size_t in_stack_00000130;
  Rgba *in_stack_00000138;
  RgbaInputFile *in_stack_00000140;
  Box<Imath_2_5::Vec2<int>_> *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  RgbaInputFile *in_stack_ffffffffffffff60;
  RgbaInputFile *this;
  int local_7c [3];
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  char *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  RgbaInputFile local_40;
  
  Imf_2_5::globalThreadCount();
  this = &local_40;
  Imf_2_5::RgbaInputFile::RgbaInputFile
            ((RgbaInputFile *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
  Imf_2_5::RgbaInputFile::dataWindow((RgbaInputFile *)0x1153b1);
  Imath_2_5::Box<Imath_2_5::Vec2<int>_>::Box
            ((Box<Imath_2_5::Vec2<int>_> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),in_stack_ffffffffffffff48
            );
  Imf_2_5::Array2D<Imf_2_5::Rgba>::Array2D
            ((Array2D<Imf_2_5::Rgba> *)CONCAT44(in_stack_ffffffffffffffa4,(local_48 - local_50) + 1)
             ,(long)in_stack_ffffffffffffff98,
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  for (; local_4c <= local_44; local_4c = local_4c + 10) {
    in_stack_ffffffffffffff60 =
         (RgbaInputFile *)
         Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[]((Array2D<Imf_2_5::Rgba> *)(local_7c + 1),0);
    Imf_2_5::RgbaInputFile::setFrameBuffer
              (in_stack_00000140,in_stack_00000138,in_stack_00000130,in_stack_00000128);
    local_7c[0] = local_4c + 9;
    in_stack_ffffffffffffff54 = local_4c;
    std::min<int>(local_7c,&local_44);
    Imf_2_5::RgbaInputFile::readPixels(this,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  }
  Imf_2_5::Array2D<Imf_2_5::Rgba>::~Array2D
            ((Array2D<Imf_2_5::Rgba> *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50)
            );
  Imf_2_5::RgbaInputFile::~RgbaInputFile(in_stack_ffffffffffffff60);
  return;
}

Assistant:

void
readRgba2 (const char fileName[])
{
    //
    // Read an RGBA image using class RgbaInputFile.
    // Read the pixels, 10 scan lines at a time, and
    // store the pixel data in a buffer that is just
    // large enough to hold 10 scan lines worth of data.
    //
    //	- open the file
    //	- allocate memory for the pixels
    //	- for each block of 10 scan lines,
    //	  describe the memory layout of the pixels,
    //	  read the pixels from the file,
    //	  process the pixels and discard them
    //

    RgbaInputFile file (fileName);
    Box2i dw = file.dataWindow();

    int width  = dw.max.x - dw.min.x + 1;

    Array2D<Rgba> pixels (10, width);

    while (dw.min.y <= dw.max.y)
    {
	file.setFrameBuffer (&pixels[0][0] - dw.min.x - dw.min.y * width,
			     1, width);

	file.readPixels (dw.min.y, min (dw.min.y + 9, dw.max.y));
	// processPixels (pixels)
	
	dw.min.y += 10;
    }
}